

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

void Gia_ManWriteMiniAig(Gia_Man_t *pGia,char *pFileName)

{
  Mini_Aig_t *p;
  FILE *__s;
  
  p = Gia_ManToMiniAig(pGia);
  __s = fopen(pFileName,"wb");
  if (__s == (FILE *)0x0) {
    printf("Cannot open file for writing \"%s\".\n",pFileName);
  }
  else {
    fwrite(&p->nSize,4,1,__s);
    fwrite(&p->nRegs,4,1,__s);
    fwrite(p->pArray,4,(long)p->nSize,__s);
    fclose(__s);
  }
  Mini_AigStop(p);
  return;
}

Assistant:

void Gia_ManWriteMiniAig( Gia_Man_t * pGia, char * pFileName )
{
    Mini_Aig_t * p = Gia_ManToMiniAig( pGia );
    Mini_AigDump( p, pFileName );
    //Mini_AigDumpVerilog( "test_miniaig.v", "top", p );
    Mini_AigStop( p );
}